

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O0

int ASN1_get_object(uchar **pp,long *plength,int *ptag,int *pclass,long omax)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uint8_t *puVar4;
  int tag_number;
  int constructed;
  int tag_class;
  CBS body;
  CBS cbs;
  CBS_ASN1_TAG tag;
  long in_len_local;
  int *out_class_local;
  int *out_tag_local;
  long *out_len_local;
  uchar **inp_local;
  
  if (omax < 0) {
    ERR_put_error(0xc,0,0x7b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_lib.cc"
                  ,0x4d);
  }
  else {
    CBS_init((CBS *)&body.len,*pp,omax);
    iVar1 = CBS_get_any_asn1((CBS *)&body.len,(CBS *)&constructed,
                             (CBS_ASN1_TAG *)((long)&cbs.len + 4));
    if ((iVar1 != 0) && (sVar3 = CBS_len((CBS *)&constructed), sVar3 < 0x40000000)) {
      uVar2 = (cbs.len._4_4_ & 0xc0000000) >> 0x18;
      if ((uVar2 == 0) && (0xff < (cbs.len._4_4_ & 0x1fffffff))) {
        ERR_put_error(0xc,0,0x7b,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_lib.cc"
                      ,99);
        return 0x80;
      }
      puVar4 = CBS_data((CBS *)&constructed);
      *pp = puVar4;
      sVar3 = CBS_len((CBS *)&constructed);
      *plength = sVar3;
      *ptag = cbs.len._4_4_ & 0x1fffffff;
      *pclass = uVar2;
      return (cbs.len._4_4_ & 0x20000000) >> 0x18;
    }
    ERR_put_error(0xc,0,0x7b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_lib.cc"
                  ,0x58);
  }
  return 0x80;
}

Assistant:

int ASN1_get_object(const unsigned char **inp, long *out_len, int *out_tag,
                    int *out_class, long in_len) {
  if (in_len < 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_HEADER_TOO_LONG);
    return 0x80;
  }

  CBS_ASN1_TAG tag;
  CBS cbs, body;
  CBS_init(&cbs, *inp, (size_t)in_len);
  if (!CBS_get_any_asn1(&cbs, &body, &tag) ||
      // Bound the length to comfortably fit in an int. Lengths in this
      // module often switch between int and long without overflow checks.
      CBS_len(&body) > INT_MAX / 2) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_HEADER_TOO_LONG);
    return 0x80;
  }

  // Convert between tag representations.
  int tag_class = (tag & CBS_ASN1_CLASS_MASK) >> CBS_ASN1_TAG_SHIFT;
  int constructed = (tag & CBS_ASN1_CONSTRUCTED) >> CBS_ASN1_TAG_SHIFT;
  int tag_number = tag & CBS_ASN1_TAG_NUMBER_MASK;

  // To avoid ambiguity with V_ASN1_NEG, impose a limit on universal tags.
  if (tag_class == V_ASN1_UNIVERSAL && tag_number > V_ASN1_MAX_UNIVERSAL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_HEADER_TOO_LONG);
    return 0x80;
  }

  *inp = CBS_data(&body);
  *out_len = CBS_len(&body);
  *out_tag = tag_number;
  *out_class = tag_class;
  return constructed;
}